

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

void __thiscall ArgsManager::LogArgs(ArgsManager *this)

{
  _Base_ptr p_Var1;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  allocator<char> local_8a;
  allocator<char> local_89;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock25;
  string local_78;
  string local_58;
  undefined8 local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock25,&this->cs_args,"cs_args",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
             ,0x359,false);
  for (p_Var1 = (this->m_settings).ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_settings).ro_config._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Config file arg:",(allocator<char> *)&local_78);
    logArgsPrefix(this,&local_58,(string *)(p_Var1 + 1),
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                   *)(p_Var1 + 2));
    std::__cxx11::string::~string((string *)&local_58);
  }
  for (p_Var1 = (this->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(this->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    UniValue::write_abi_cxx11_((UniValue *)&local_58,(int)p_Var1 + 0x40,(void *)0x0,0);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
    ;
    source_file._M_len = 0x5f;
    logging_function._M_str = "LogArgs";
    logging_function._M_len = 7;
    LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,0x35e,ALL,Info,(ConstevalFormatString<2U>)0x1980a7,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Command-line arg:",&local_89);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_8a);
  logArgsPrefix(this,&local_58,&local_78,&(this->m_settings).command_line_options);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock25.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ArgsManager::LogArgs() const
{
    LOCK(cs_args);
    for (const auto& section : m_settings.ro_config) {
        logArgsPrefix("Config file arg:", section.first, section.second);
    }
    for (const auto& setting : m_settings.rw_settings) {
        LogPrintf("Setting file arg: %s = %s\n", setting.first, setting.second.write());
    }
    logArgsPrefix("Command-line arg:", "", m_settings.command_line_options);
}